

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O2

double __thiscall
f8n::prefs::Preferences::GetDouble(Preferences *this,char *key,double defaultValue)

{
  double extraout_XMM0_Qa;
  allocator<char> local_39;
  double local_38;
  string local_30 [32];
  
  local_38 = defaultValue;
  std::__cxx11::string::string<std::allocator<char>>(local_30,key,&local_39);
  (*(this->super_IPreferences)._vptr_IPreferences[0xc])(local_38,this,local_30);
  local_38 = extraout_XMM0_Qa;
  std::__cxx11::string::~string(local_30);
  return local_38;
}

Assistant:

double Preferences::GetDouble(const char* key, double defaultValue) {
    return this->GetDouble(std::string(key), defaultValue);
}